

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void explainSimpleCount(Parse *pParse,Table *pTab,Index *pIdx)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (pParse->explain != '\x02') {
    return;
  }
  if (pIdx == (Index *)0x0) {
    pcVar1 = pTab->zName;
LAB_00177fac:
    pcVar2 = "";
    pcVar3 = "";
  }
  else {
    if ((pTab->tabFlags & 0x20) == 0) {
      pcVar1 = pTab->zName;
    }
    else {
      pcVar1 = pTab->zName;
      if ((*(ushort *)&pIdx->field_0x63 & 3) == 2) goto LAB_00177fac;
    }
    pcVar3 = pIdx->zName;
    pcVar2 = " USING COVERING INDEX ";
  }
  sqlite3VdbeExplain(pParse,'\0',"SCAN TABLE %s%s%s",pcVar1,pcVar2,pcVar3);
  return;
}

Assistant:

static void explainSimpleCount(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being queried */
  Index *pIdx                     /* Index used to optimize scan, or NULL */
){
  if( pParse->explain==2 ){
    int bCover = (pIdx!=0 && (HasRowid(pTab) || !IsPrimaryKeyIndex(pIdx)));
    sqlite3VdbeExplain(pParse, 0, "SCAN TABLE %s%s%s",
        pTab->zName,
        bCover ? " USING COVERING INDEX " : "",
        bCover ? pIdx->zName : ""
    );
  }
}